

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
          (PipelineResourceSignatureDescWrapper *this)

{
  PipelineResourceSignatureDescWrapper *this_local;
  
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->m_StringPool);
  std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
  ~vector(&this->m_ImmutableSamplers);
  std::vector<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>::
  ~vector(&this->m_Resources);
  std::__cxx11::string::~string((string *)&this->m_CombinedSamplerSuffix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PipelineResourceSignatureDescWrapper() = default;